

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O2

bool __thiscall
irr::io::CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase>::setText
          (CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase> *this,unsigned_short *start,
          unsigned_short *end)

{
  bool bVar1;
  long lVar2;
  ushort *puVar3;
  string<unsigned_short> s;
  undefined1 local_30 [32];
  
  lVar2 = (long)end - (long)start >> 1;
  puVar3 = start;
  if (lVar2 < 3) {
    for (; puVar3 != end; puVar3 = puVar3 + 1) {
      if ((0x20 < (ulong)*puVar3) || ((0x100002600U >> ((ulong)*puVar3 & 0x3f) & 1) == 0))
      goto LAB_005b0bc5;
    }
    bVar1 = false;
  }
  else {
LAB_005b0bc5:
    core::string<unsigned_short>::string<unsigned_short>
              ((string<unsigned_short> *)(local_30 + 0x10),start,(s32)lVar2);
    replaceSpecialCharacters
              ((CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase> *)local_30,
               (string<unsigned_short> *)this);
    core::string<unsigned_short>::operator=(&this->NodeName,(string<unsigned_short> *)local_30);
    core::string<unsigned_short>::~string((string<unsigned_short> *)local_30);
    this->CurrentNodeType = EXN_TEXT;
    core::string<unsigned_short>::~string((string<unsigned_short> *)(local_30 + 0x10));
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool setText(char_type* start, char_type* end)
	{
		// check if text is more than 2 characters, and if not, check if there is 
		// only white space, so that this text won't be reported
		if (end - start < 3)
		{
			char_type* p = start;
			for(; p != end; ++p)
				if (!isWhiteSpace(*p))
					break;

			if (p == end)
				return false;
		}

		// set current text to the parsed text, and replace xml special characters
		core::string<char_type> s(start, (int)(end - start));
		NodeName = replaceSpecialCharacters(s);

		// current XML node type is text
		CurrentNodeType = EXN_TEXT;

		return true;
	}